

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v11::detail::utf8_decode(char *s,uint32_t *c,int *e)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = (uint)((byte)*s >> 3);
  lVar3 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar1];
  uVar2 = ((uint)(byte)*s & *(uint *)(&DAT_0037d1f0 + lVar3 * 4)) << 0x12;
  *c = uVar2;
  uVar2 = ((byte)s[1] & 0x3f) << 0xc | uVar2;
  *c = uVar2;
  uVar2 = ((byte)s[2] & 0x3f) << 6 | uVar2;
  *c = uVar2;
  uVar2 = ((byte)s[3] & 0x3f | uVar2) >> ((&DAT_0037d230)[lVar3 * 4] & 0x1f);
  *c = uVar2;
  uVar2 = (uint)(uVar2 < *(uint *)(&DAT_0037d210 + lVar3 * 4)) << 6;
  *e = uVar2;
  uVar2 = (uint)((*c & 0xfffff800) == 0xd800) << 7 | uVar2;
  *e = uVar2;
  uVar2 = (uint)(0x10ffff < *c) << 8 | uVar2;
  *e = uVar2;
  uVar2 = (byte)s[1] >> 2 & 0x30 | uVar2;
  *e = uVar2;
  uVar2 = (byte)s[2] >> 4 & 0xc | uVar2;
  *e = uVar2;
  *e = (((byte)s[3] >> 6 | uVar2) ^ 0x2a) >> ((&DAT_0037d250)[lVar3 * 4] & 0x1f);
  return s + (ulong)((0x80ff0000U >> uVar1 & 1) != 0) + lVar3;
}

Assistant:

FMT_CONSTEXPR inline auto utf8_decode(const char* s, uint32_t* c, int* e)
    -> const char* {
  constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
  constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
  constexpr const int shiftc[] = {0, 18, 12, 6, 0};
  constexpr const int shifte[] = {0, 6, 4, 2, 0};

  int len = "\1\1\1\1\1\1\1\1\1\1\1\1\1\1\1\1\0\0\0\0\0\0\0\0\2\2\2\2\3\3\4"
      [static_cast<unsigned char>(*s) >> 3];
  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  const char* next = s + len + !len;

  using uchar = unsigned char;

  // Assume a four-byte character and load four bytes. Unused bits are
  // shifted out.
  *c = uint32_t(uchar(s[0]) & masks[len]) << 18;
  *c |= uint32_t(uchar(s[1]) & 0x3f) << 12;
  *c |= uint32_t(uchar(s[2]) & 0x3f) << 6;
  *c |= uint32_t(uchar(s[3]) & 0x3f) << 0;
  *c >>= shiftc[len];

  // Accumulate the various error conditions.
  *e = (*c < mins[len]) << 6;       // non-canonical encoding
  *e |= ((*c >> 11) == 0x1b) << 7;  // surrogate half?
  *e |= (*c > 0x10FFFF) << 8;       // out of range?
  *e |= (uchar(s[1]) & 0xc0) >> 2;
  *e |= (uchar(s[2]) & 0xc0) >> 4;
  *e |= uchar(s[3]) >> 6;
  *e ^= 0x2a;  // top two bits of each tail byte correct?
  *e >>= shifte[len];

  return next;
}